

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

uint rlCompileShader(char *shaderCode,int type)

{
  GLchar *__ptr;
  char *log;
  GLint local_20;
  int length;
  int maxLength;
  GLint success;
  uint shader;
  int type_local;
  char *shaderCode_local;
  
  maxLength = 0;
  success = type;
  _shader = shaderCode;
  maxLength = (*glad_glCreateShader)(type);
  (*glad_glShaderSource)(maxLength,1,(GLchar **)&shader,(GLint *)0x0);
  length = 0;
  (*glad_glCompileShader)(maxLength);
  (*glad_glGetShaderiv)(maxLength,0x8b81,&length);
  if (length == 0) {
    if (success == 0x8b30) {
      TraceLog(4,"SHADER: [ID %i] Failed to compile fragment shader code",(ulong)(uint)maxLength);
    }
    else if (success == 0x8b31) {
      TraceLog(4,"SHADER: [ID %i] Failed to compile vertex shader code",(ulong)(uint)maxLength);
    }
    local_20 = 0;
    (*glad_glGetShaderiv)(maxLength,0x8b84,&local_20);
    if (0 < local_20) {
      log._4_4_ = 0;
      __ptr = (GLchar *)calloc((long)local_20,1);
      (*glad_glGetShaderInfoLog)(maxLength,local_20,(GLsizei *)((long)&log + 4),__ptr);
      TraceLog(4,"SHADER: [ID %i] Compile error: %s",(ulong)(uint)maxLength,__ptr);
      free(__ptr);
    }
  }
  else if (success == 0x8b30) {
    TraceLog(3,"SHADER: [ID %i] Fragment shader compiled successfully",(ulong)(uint)maxLength);
  }
  else if (success == 0x8b31) {
    TraceLog(3,"SHADER: [ID %i] Vertex shader compiled successfully",(ulong)(uint)maxLength);
  }
  return maxLength;
}

Assistant:

unsigned int rlCompileShader(const char *shaderCode, int type)
{
    unsigned int shader = 0;

#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    shader = glCreateShader(type);
    glShaderSource(shader, 1, &shaderCode, NULL);

    GLint success = 0;
    glCompileShader(shader);
    glGetShaderiv(shader, GL_COMPILE_STATUS, &success);

    if (success == GL_FALSE)
    {
        switch (type)
        {
            case GL_VERTEX_SHADER: TRACELOG(LOG_WARNING, "SHADER: [ID %i] Failed to compile vertex shader code", shader); break;
            case GL_FRAGMENT_SHADER: TRACELOG(LOG_WARNING, "SHADER: [ID %i] Failed to compile fragment shader code", shader); break;
            //case GL_GEOMETRY_SHADER:
            //case GL_COMPUTE_SHADER:
            default: break;
        }

        int maxLength = 0;
        glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &maxLength);

        if (maxLength > 0)
        {
            int length = 0;
            char *log = RL_CALLOC(maxLength, sizeof(char));
            glGetShaderInfoLog(shader, maxLength, &length, log);
            TRACELOG(LOG_WARNING, "SHADER: [ID %i] Compile error: %s", shader, log);
            RL_FREE(log);
        }
    }
    else
    {
        switch (type)
        {
            case GL_VERTEX_SHADER: TRACELOG(LOG_INFO, "SHADER: [ID %i] Vertex shader compiled successfully", shader); break;
            case GL_FRAGMENT_SHADER: TRACELOG(LOG_INFO, "SHADER: [ID %i] Fragment shader compiled successfully", shader); break;
            //case GL_GEOMETRY_SHADER:
            //case GL_COMPUTE_SHADER:
            default: break;
        }
    }
#endif

    return shader;
}